

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

char * luaX_token2str(LexState *ls,int token)

{
  ushort **ppuVar1;
  char *pcVar2;
  
  if (token < 0x101) {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[token] & 2) == 0) {
      pcVar2 = "%c";
    }
    else {
      pcVar2 = "char(%d)";
    }
    pcVar2 = luaO_pushfstring(ls->L,pcVar2,token);
    return pcVar2;
  }
  return luaX_tokens[token - 0x101];
}

Assistant:

static const char*luaX_token2str(LexState*ls,int token){
if(token<257){
return(iscntrl(token))?luaO_pushfstring(ls->L,"char(%d)",token):
luaO_pushfstring(ls->L,"%c",token);
}
else
return luaX_tokens[token-257];
}